

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O2

void Map_SuperTableSortSupergates(Map_HashTable_t *p,int nSupersMax)

{
  Map_HashEntry_t *pMVar1;
  Map_Super_t *pMVar2;
  long *__base;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  Map_HashEntry_t **ppMVar6;
  Map_Super_t **ppMVar7;
  long *plVar8;
  long lVar9;
  
  __base = (long *)malloc((long)nSupersMax << 3);
  uVar4 = 0;
  uVar3 = (ulong)(uint)p->nBins;
  if (p->nBins < 1) {
    uVar3 = uVar4;
  }
  iVar5 = 0;
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    ppMVar6 = p->pBins + uVar4;
    while (pMVar1 = *ppMVar6, pMVar1 != (Map_HashEntry_t *)0x0) {
      plVar8 = __base + iVar5;
      ppMVar7 = &pMVar1->pGates;
      while (pMVar2 = *ppMVar7, pMVar2 != (Map_Super_t *)0x0) {
        *plVar8 = (long)pMVar2;
        iVar5 = iVar5 + 1;
        plVar8 = plVar8 + 1;
        ppMVar7 = &pMVar2->pNext;
      }
      ppMVar6 = &pMVar1->pNext;
    }
  }
  qsort(__base,(long)iVar5,8,Map_SuperTableCompareSupergates);
  if (*(int *)(__base[(long)iVar5 - 1] + 0xc) <= *(int *)(*__base + 0xc)) {
    lVar9 = 0;
    while ((lVar9 != 10 && (*(int *)(__base[lVar9] + 0xc) != 0))) {
      printf("%5d : ");
      printf("%5d   ",(ulong)*(uint *)__base[lVar9]);
      printf("A = %5.2f   ",(double)*(float *)(__base[lVar9] + 0xec));
      printf("D = %5.2f   ",(double)*(float *)(__base[lVar9] + 0xe0));
      printf("%s",*(undefined8 *)(__base[lVar9] + 0xf0));
      putchar(10);
      lVar9 = lVar9 + 1;
    }
    free(__base);
    return;
  }
  __assert_fail("Map_SuperTableCompareSupergates( ppSupers, ppSupers + nSupers - 1 ) <= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTable.c"
                ,0x14d,"void Map_SuperTableSortSupergates(Map_HashTable_t *, int)");
}

Assistant:

void Map_SuperTableSortSupergates( Map_HashTable_t * p, int nSupersMax )
{
    Map_HashEntry_t * pEnt;
    Map_Super_t ** ppSupers;
    Map_Super_t * pSuper;
    int nSupers, i;

    // copy all the supergates into one array
    ppSupers = ABC_ALLOC( Map_Super_t *, nSupersMax );
    nSupers = 0;
    for ( i = 0; i < p->nBins; i++ )
        for ( pEnt = p->pBins[i]; pEnt; pEnt = pEnt->pNext )
            for ( pSuper = pEnt->pGates; pSuper; pSuper = pSuper->pNext )
                ppSupers[nSupers++] = pSuper;

    // sort by usage
    qsort( (void *)ppSupers, (size_t)nSupers, sizeof(Map_Super_t *), 
            (int (*)(const void *, const void *)) Map_SuperTableCompareSupergates );
    assert( Map_SuperTableCompareSupergates( ppSupers, ppSupers + nSupers - 1 ) <= 0 );

    // print out the "top ten"
//    for ( i = 0; i < nSupers; i++ )
    for ( i = 0; i < 10; i++ )
    {
        if ( ppSupers[i]->nUsed == 0 )
            break;
        printf( "%5d : ",        ppSupers[i]->nUsed );
        printf( "%5d   ",        ppSupers[i]->Num );
        printf( "A = %5.2f   ",  ppSupers[i]->Area );
        printf( "D = %5.2f   ",  ppSupers[i]->tDelayMax.Rise );
        printf( "%s",            ppSupers[i]->pFormula );
        printf( "\n" );
    }
    ABC_FREE( ppSupers );
}